

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O0

int ConnectRoboteq(ROBOTEQ *pRoboteq,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char local_238 [8];
  char response [256];
  uint local_12c;
  char local_128 [4];
  int channel;
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  ROBOTEQ *pRoboteq_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pRoboteq->szCfgFilePath,0,0x100);
  sprintf(pRoboteq->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pRoboteq->szDevPath,0,0x100);
    sprintf(pRoboteq->szDevPath,"COM1");
    pRoboteq->BaudRate = 0x2580;
    pRoboteq->timeout = 1000;
    pRoboteq->threadperiod = 100;
    pRoboteq->bSaveRawData = 1;
    pRoboteq->bEcho = 1;
    for (local_12c = 0; (int)local_12c < 3; local_12c = local_12c + 1) {
      pRoboteq->MinPWs[(int)local_12c] = 1000;
      pRoboteq->MidPWs[(int)local_12c] = 0x5dc;
      pRoboteq->MaxPWs[(int)local_12c] = 2000;
      pRoboteq->InitPWs[(int)local_12c] = 0x5dc;
      pRoboteq->ThresholdPWs[(int)local_12c] = 0;
      pRoboteq->CoefPWs[(int)local_12c] = 1.0;
      pRoboteq->bProportionalPWs[(int)local_12c] = 1;
    }
    for (local_12c = 0; (int)local_12c < 8; local_12c = local_12c + 1) {
      pRoboteq->analoginputoffset[(int)local_12c] = 0.0;
      pRoboteq->analoginputthreshold[(int)local_12c] = 0.0;
      pRoboteq->analoginputcoef[(int)local_12c] = 1.0;
      pRoboteq->analoginputx[(int)local_12c] = 0.0;
      pRoboteq->analoginputy[(int)local_12c] = 0.0;
      pRoboteq->analoginputz[(int)local_12c] = 0.0;
      pRoboteq->analoginputphi[(int)local_12c] = 0.0;
      pRoboteq->analoginputtheta[(int)local_12c] = 0.0;
      pRoboteq->analoginputpsi[(int)local_12c] = 0.0;
      pRoboteq->analoginputmin[(int)local_12c] = 0.0;
      pRoboteq->analoginputmax[(int)local_12c] = 0.0;
    }
    pRoboteq->rudderchan = 2;
    pRoboteq->rightthrusterchan = 1;
    pRoboteq->leftthrusterchan = 0;
    pRoboteq->vbat1analoginputchan = -1;
    pRoboteq->ibat1analoginputchan = -1;
    pRoboteq->vbat2analoginputchan = -1;
    pRoboteq->ibat2analoginputchan = -1;
    pRoboteq->vbat3analoginputchan = -1;
    pRoboteq->ibat3analoginputchan = -1;
    pRoboteq->switchanaloginputchan = -1;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pRoboteq->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->bEcho);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      for (local_12c = 0; (int)local_12c < 3; local_12c = local_12c + 1) {
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->MinPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->MidPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->MaxPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->InitPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->ThresholdPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->CoefPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%d",pRoboteq->bProportionalPWs + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
      }
      for (local_12c = 0; (int)local_12c < 8; local_12c = local_12c + 1) {
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputoffset + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputthreshold + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputcoef + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputx + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputy + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputz + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputphi + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputtheta + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputpsi + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputmin + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
        pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
        if (pcVar2 == (char *)0x0) {
          printf("Invalid configuration file.\n");
        }
        iVar1 = __isoc99_sscanf(local_128,"%lf",pRoboteq->analoginputmax + (int)local_12c);
        if (iVar1 != 1) {
          printf("Invalid configuration file.\n");
        }
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->rudderchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->rightthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->leftthrusterchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->vbat1analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->ibat1analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->vbat2analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->ibat2analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->vbat3analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->ibat3analoginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pRoboteq->switchanaloginputchan);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pRoboteq->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pRoboteq->threadperiod = 100;
  }
  for (local_12c = 0; (int)local_12c < 3; local_12c = local_12c + 1) {
    if (((((((pRoboteq->MinPWs[(int)local_12c] < 500) || (0x9c4 < pRoboteq->MinPWs[(int)local_12c]))
           || (pRoboteq->MidPWs[(int)local_12c] < 500)) ||
          ((0x9c4 < pRoboteq->MidPWs[(int)local_12c] || (pRoboteq->MaxPWs[(int)local_12c] < 500))))
         || (0x9c4 < pRoboteq->MaxPWs[(int)local_12c])) ||
        ((pRoboteq->InitPWs[(int)local_12c] != 0 &&
         (((pRoboteq->InitPWs[(int)local_12c] < 500 || (0x9c4 < pRoboteq->InitPWs[(int)local_12c]))
          || ((pRoboteq->InitPWs[(int)local_12c] < pRoboteq->MinPWs[(int)local_12c] ||
              (pRoboteq->MaxPWs[(int)local_12c] < pRoboteq->InitPWs[(int)local_12c])))))))) ||
       (((pRoboteq->MidPWs[(int)local_12c] < pRoboteq->MinPWs[(int)local_12c] ||
         (pRoboteq->MaxPWs[(int)local_12c] < pRoboteq->MidPWs[(int)local_12c])) ||
        (pRoboteq->ThresholdPWs[(int)local_12c] < 0)))) {
      printf("Invalid parameters : PWM channel %d.\n",(ulong)local_12c);
      pRoboteq->MinPWs[(int)local_12c] = 1000;
      pRoboteq->MidPWs[(int)local_12c] = 0x5dc;
      pRoboteq->MaxPWs[(int)local_12c] = 2000;
      pRoboteq->InitPWs[(int)local_12c] = 0x5dc;
      pRoboteq->ThresholdPWs[(int)local_12c] = 0;
      pRoboteq->CoefPWs[(int)local_12c] = 1.0;
      pRoboteq->bProportionalPWs[(int)local_12c] = 1;
    }
  }
  for (local_12c = 0; (int)local_12c < 3; local_12c = local_12c + 1) {
    pRoboteq->LastPWs[(int)local_12c] = 0;
  }
  for (local_12c = 0; (int)local_12c < 8; local_12c = local_12c + 1) {
    pRoboteq->LastAIs[(int)local_12c] = 0;
  }
  if ((pRoboteq->rudderchan < 0) || (2 < pRoboteq->rudderchan)) {
    printf("Invalid parameter : rudderchan.\n");
    pRoboteq->rudderchan = 2;
  }
  if ((pRoboteq->rightthrusterchan < 0) || (2 < pRoboteq->rightthrusterchan)) {
    printf("Invalid parameter : rightthrusterchan.\n");
    pRoboteq->rightthrusterchan = 1;
  }
  if ((pRoboteq->leftthrusterchan < 0) || (2 < pRoboteq->leftthrusterchan)) {
    printf("Invalid parameter : leftthrusterchan.\n");
    pRoboteq->leftthrusterchan = 0;
  }
  if ((pRoboteq->vbat1analoginputchan < -1) || (7 < pRoboteq->vbat1analoginputchan)) {
    printf("Invalid parameter : vbat1analoginputchan.\n");
    pRoboteq->vbat1analoginputchan = -1;
  }
  if ((pRoboteq->ibat1analoginputchan < -1) || (7 < pRoboteq->ibat1analoginputchan)) {
    printf("Invalid parameter : ibat1analoginputchan.\n");
    pRoboteq->ibat1analoginputchan = -1;
  }
  if ((pRoboteq->vbat2analoginputchan < -1) || (7 < pRoboteq->vbat2analoginputchan)) {
    printf("Invalid parameter : vbat2analoginputchan.\n");
    pRoboteq->vbat2analoginputchan = -1;
  }
  if ((pRoboteq->ibat2analoginputchan < -1) || (7 < pRoboteq->ibat2analoginputchan)) {
    printf("Invalid parameter : ibat2analoginputchan.\n");
    pRoboteq->ibat2analoginputchan = -1;
  }
  if ((pRoboteq->vbat3analoginputchan < -1) || (7 < pRoboteq->vbat3analoginputchan)) {
    printf("Invalid parameter : vbat3analoginputchan.\n");
    pRoboteq->vbat3analoginputchan = -1;
  }
  if ((pRoboteq->ibat3analoginputchan < -1) || (7 < pRoboteq->ibat3analoginputchan)) {
    printf("Invalid parameter : ibat3analoginputchan.\n");
    pRoboteq->ibat3analoginputchan = -1;
  }
  if ((pRoboteq->switchanaloginputchan < -1) || (7 < pRoboteq->switchanaloginputchan)) {
    printf("Invalid parameter : switchanaloginputchan.\n");
    pRoboteq->switchanaloginputchan = -1;
  }
  iVar1 = OpenRS232Port(&pRoboteq->RS232Port,pRoboteq->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pRoboteq->RS232Port,pRoboteq->BaudRate,'\0',0,'\b','\0',
                                pRoboteq->timeout);
    if (iVar1 == 0) {
      iVar1 = IssueCommandRoboteq(pRoboteq,"?","FID","",10,local_238,0);
      if (iVar1 == 0) {
        sVar3 = strlen(local_238);
        if (sVar3 < 0xc) {
          printf("Warning : A Roboteq has an unrecognized version.\n");
        }
        printf("Roboteq connected.\n");
        pRoboteq_local._4_4_ = 0;
      }
      else {
        printf("Unable to connect to a Roboteq : FID failure.\n");
        CloseRS232Port(&pRoboteq->RS232Port);
        pRoboteq_local._4_4_ = 1;
      }
    }
    else {
      printf("Unable to connect to a Roboteq.\n");
      CloseRS232Port(&pRoboteq->RS232Port);
      pRoboteq_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a Roboteq.\n");
    pRoboteq_local._4_4_ = 1;
  }
  return pRoboteq_local._4_4_;
}

Assistant:

inline int ConnectRoboteq(ROBOTEQ* pRoboteq, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];
	int channel = 0;
	char response[256];

	memset(pRoboteq->szCfgFilePath, 0, sizeof(pRoboteq->szCfgFilePath));
	sprintf(pRoboteq->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pRoboteq->szDevPath, 0, sizeof(pRoboteq->szDevPath));
		sprintf(pRoboteq->szDevPath, "COM1");
		pRoboteq->BaudRate = 9600;
		pRoboteq->timeout = 1000;
		pRoboteq->threadperiod = 100;
		pRoboteq->bSaveRawData = 1;
		pRoboteq->bEcho = 1;
		for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
		{
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
		for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
		{
			pRoboteq->analoginputoffset[channel] = 0;
			pRoboteq->analoginputthreshold[channel] = 0;
			pRoboteq->analoginputcoef[channel] = 1;
			pRoboteq->analoginputx[channel] = 0;
			pRoboteq->analoginputy[channel] = 0;
			pRoboteq->analoginputz[channel] = 0;
			pRoboteq->analoginputphi[channel] = 0;
			pRoboteq->analoginputtheta[channel] = 0;
			pRoboteq->analoginputpsi[channel] = 0;
			pRoboteq->analoginputmin[channel] = 0;
			pRoboteq->analoginputmax[channel] = 0;
		}
		pRoboteq->rudderchan = 2;
		pRoboteq->rightthrusterchan = 1;
		pRoboteq->leftthrusterchan = 0;
		pRoboteq->vbat1analoginputchan = -1;
		pRoboteq->ibat1analoginputchan = -1;
		pRoboteq->vbat2analoginputchan = -1;
		pRoboteq->ibat2analoginputchan = -1;
		pRoboteq->vbat3analoginputchan = -1;
		pRoboteq->ibat3analoginputchan = -1;
		pRoboteq->switchanaloginputchan = -1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pRoboteq->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->bEcho) != 1) printf("Invalid configuration file.\n");

			for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MinPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MidPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->MaxPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->InitPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->ThresholdPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->CoefPWs[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%d", &pRoboteq->bProportionalPWs[channel]) != 1) printf("Invalid configuration file.\n");
			}

			for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
			{
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputoffset[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputthreshold[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputcoef[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputx[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputy[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputz[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputphi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputtheta[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputpsi[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmin[channel]) != 1) printf("Invalid configuration file.\n");
				if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
				if (sscanf(line, "%lf", &pRoboteq->analoginputmax[channel]) != 1) printf("Invalid configuration file.\n");
			}

			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rudderchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->rightthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->leftthrusterchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat1analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat2analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->vbat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->ibat3analoginputchan) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pRoboteq->switchanaloginputchan) != 1) printf("Invalid configuration file.\n");

			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pRoboteq->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pRoboteq->threadperiod = 100;
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (
			(pRoboteq->MinPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MinPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MidPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MidPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MaxPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->MaxPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)
			||(
			(pRoboteq->InitPWs[channel] != 0)&&
			((pRoboteq->InitPWs[channel] < DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ)||(pRoboteq->InitPWs[channel] > DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ)||
			(pRoboteq->MinPWs[channel] > pRoboteq->InitPWs[channel])||(pRoboteq->InitPWs[channel] > pRoboteq->MaxPWs[channel]))			
			)||
			(pRoboteq->MinPWs[channel] > pRoboteq->MidPWs[channel])||(pRoboteq->MidPWs[channel] > pRoboteq->MaxPWs[channel])||
			(pRoboteq->ThresholdPWs[channel] < 0)
			)
		{
			printf("Invalid parameters : PWM channel %d.\n", channel);
			pRoboteq->MinPWs[channel] = 1000;
			pRoboteq->MidPWs[channel] = 1500;
			pRoboteq->MaxPWs[channel] = 2000;
			pRoboteq->InitPWs[channel] = 1500;
			pRoboteq->ThresholdPWs[channel] = 0;
			pRoboteq->CoefPWs[channel] = 1;
			pRoboteq->bProportionalPWs[channel] = 1;
		}
	}

	// Used to save raw data, should be handled specifically...
	//pRoboteq->pfSaveFile = NULL;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		pRoboteq->LastPWs[channel] = 0;
	}

	for (channel = 0; channel < NB_CHANNELS_AI_ROBOTEQ; channel++)
	{
		pRoboteq->LastAIs[channel] = 0;
	}

	if ((pRoboteq->rudderchan < 0)||(pRoboteq->rudderchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rudderchan.\n");
		pRoboteq->rudderchan = 2;
	}
	if ((pRoboteq->rightthrusterchan < 0)||(pRoboteq->rightthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : rightthrusterchan.\n");
		pRoboteq->rightthrusterchan = 1;
	}
	if ((pRoboteq->leftthrusterchan < 0)||(pRoboteq->leftthrusterchan >= NB_CHANNELS_PWM_ROBOTEQ))
	{
		printf("Invalid parameter : leftthrusterchan.\n");
		pRoboteq->leftthrusterchan = 0;
	}

	if ((pRoboteq->vbat1analoginputchan < -1)||(pRoboteq->vbat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat1analoginputchan.\n");
		pRoboteq->vbat1analoginputchan = -1;
	}
	if ((pRoboteq->ibat1analoginputchan < -1)||(pRoboteq->ibat1analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat1analoginputchan.\n");
		pRoboteq->ibat1analoginputchan = -1;
	}
	if ((pRoboteq->vbat2analoginputchan < -1)||(pRoboteq->vbat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat2analoginputchan.\n");
		pRoboteq->vbat2analoginputchan = -1;
	}
	if ((pRoboteq->ibat2analoginputchan < -1)||(pRoboteq->ibat2analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat2analoginputchan.\n");
		pRoboteq->ibat2analoginputchan = -1;
	}
	if ((pRoboteq->vbat3analoginputchan < -1)||(pRoboteq->vbat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : vbat3analoginputchan.\n");
		pRoboteq->vbat3analoginputchan = -1;
	}
	if ((pRoboteq->ibat3analoginputchan < -1)||(pRoboteq->ibat3analoginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : ibat3analoginputchan.\n");
		pRoboteq->ibat3analoginputchan = -1;
	}
	if ((pRoboteq->switchanaloginputchan < -1)||(pRoboteq->switchanaloginputchan >= NB_CHANNELS_AI_ROBOTEQ))
	{
		printf("Invalid parameter : switchanaloginputchan.\n");
		pRoboteq->switchanaloginputchan = -1;
	}

	if (OpenRS232Port(&pRoboteq->RS232Port, pRoboteq->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pRoboteq->RS232Port, pRoboteq->BaudRate, NOPARITY, FALSE, 8,
		ONESTOPBIT, (UINT)pRoboteq->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "?", "FID", "", 10, response, FALSE) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a Roboteq : FID failure.\n");
		CloseRS232Port(&pRoboteq->RS232Port);
		return EXIT_FAILURE;
	}
	if (strlen(response) < 12)
	{
		printf("Warning : A Roboteq has an unrecognized version.\n");
	}

	printf("Roboteq connected.\n");

	return EXIT_SUCCESS;
}